

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

aiMatrix4x4 * __thiscall
Assimp::XGLImporter::ReadTrafo(aiMatrix4x4 *__return_storage_ptr__,XGLImporter *this)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 in_XMM1_Db;
  float fVar6;
  aiVector3D aVar7;
  aiVector3D aVar8;
  aiVector3D aVar9;
  float local_b0;
  float local_ac;
  undefined8 local_a8;
  undefined8 local_98;
  float local_88;
  float fStack_84;
  float local_68;
  float fStack_64;
  string local_50;
  
  bVar1 = ReadElementUpToClosing(this,"transform");
  if (bVar1) {
    fVar3 = 1.0;
    aVar7 = (aiVector3D)ZEXT812(0);
    local_a8 = 0;
    local_98 = 0;
    aVar8 = (aiVector3D)ZEXT812(0);
    do {
      GetElementName_abi_cxx11_(&local_50,this);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar2 == 0) {
        aVar8 = ReadVec3(this);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar2 == 0) {
          aVar9 = ReadVec3(this);
          local_a8 = aVar9._0_8_;
          local_98 = CONCAT44(in_XMM1_Db,aVar9.z);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar2 == 0) {
            aVar7 = ReadVec3(this);
          }
        }
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if ((iVar2 == 0) && (fVar3 = ReadFloat(this), fVar3 < 0.0)) {
        LogFunctions<Assimp::XGLImporter>::LogError((char *)0x5cc7b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar1 = ReadElementUpToClosing(this,"transform");
    } while (bVar1);
  }
  else {
    fVar3 = 1.0;
    aVar8 = (aiVector3D)ZEXT812(0);
    local_98 = 0;
    local_a8 = 0;
    aVar7 = (aiVector3D)ZEXT812(0);
  }
  local_ac = aVar7.z;
  local_b0 = aVar8.z;
  __return_storage_ptr__->a1 = 1.0;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->a3 = 0.0;
  __return_storage_ptr__->a4 = 0.0;
  __return_storage_ptr__->b1 = 0.0;
  __return_storage_ptr__->b2 = 1.0;
  __return_storage_ptr__->b3 = 0.0;
  __return_storage_ptr__->b4 = 0.0;
  __return_storage_ptr__->c1 = 0.0;
  __return_storage_ptr__->c2 = 0.0;
  __return_storage_ptr__->c3 = 1.0;
  __return_storage_ptr__->c4 = 0.0;
  __return_storage_ptr__->d1 = 0.0;
  __return_storage_ptr__->d2 = 0.0;
  __return_storage_ptr__->d3 = 0.0;
  __return_storage_ptr__->d4 = 1.0;
  local_88 = aVar8.x;
  fStack_84 = aVar8.y;
  auVar5._0_4_ = local_b0 * local_b0 + local_88 * local_88 + fStack_84 * fStack_84;
  if (0.0001 <= auVar5._0_4_) {
    fVar6 = (float)local_98 * (float)local_98 +
            (float)local_a8 * (float)local_a8 + local_a8._4_4_ * local_a8._4_4_;
    if (0.0001 <= fVar6) {
      auVar4._4_8_ = 0;
      auVar4._0_4_ = auVar5._0_4_;
      auVar4._12_4_ = local_98._4_4_;
      auVar5._8_8_ = auVar4._8_8_;
      auVar5._4_4_ = fVar6;
      auVar5 = sqrtps(auVar5,auVar5);
      auVar5 = divps(_DAT_006a6200,auVar5);
      fVar6 = auVar5._0_4_;
      local_88 = local_88 * fVar6;
      local_b0 = local_b0 * fVar6;
      fStack_84 = fStack_84 * fVar6;
      fVar6 = auVar5._4_4_;
      local_a8._4_4_ = local_a8._4_4_ * fVar6;
      local_a8._0_4_ = (float)local_a8 * fVar6;
      local_98._0_4_ = (float)local_98 * fVar6;
      if (ABS((float)local_98 * local_b0 + (float)local_a8 * local_88 + fStack_84 * local_a8._4_4_)
          <= 0.0001) {
        __return_storage_ptr__->a1 =
             (fStack_84 * (float)local_98 - local_a8._4_4_ * local_b0) * fVar3;
        __return_storage_ptr__->a2 = (float)local_a8 * fVar3;
        __return_storage_ptr__->b1 =
             (local_b0 * (float)local_a8 - (float)local_98 * local_88) * fVar3;
        __return_storage_ptr__->b2 = local_a8._4_4_ * fVar3;
        __return_storage_ptr__->c1 =
             (local_88 * local_a8._4_4_ - (float)local_a8 * fStack_84) * fVar3;
        __return_storage_ptr__->c2 = (float)local_98 * fVar3;
        __return_storage_ptr__->a3 = local_88 * fVar3;
        __return_storage_ptr__->b3 = fVar3 * fStack_84;
        __return_storage_ptr__->c3 = local_b0 * fVar3;
        local_68 = aVar7.x;
        fStack_64 = aVar7.y;
        __return_storage_ptr__->a4 = local_68;
        __return_storage_ptr__->b4 = fStack_64;
        __return_storage_ptr__->c4 = local_ac;
        return __return_storage_ptr__;
      }
    }
  }
  LogFunctions<Assimp::XGLImporter>::LogError((char *)0x5cc8bb);
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 XGLImporter::ReadTrafo()
{
    aiVector3D forward, up, right, position;
    float scale = 1.0f;

    while (ReadElementUpToClosing("transform")) {
        const std::string& s = GetElementName();
        if (s == "forward") {
            forward = ReadVec3();
        }
        else if (s == "up") {
            up = ReadVec3();
        }
        else if (s == "position") {
            position = ReadVec3();
        }
        if (s == "scale") {
            scale = ReadFloat();
            if(scale < 0.f) {
                // this is wrong, but we can leave the value and pass it to the caller
                LogError("found negative scaling in <transform>, ignoring");
            }
        }
    }

    aiMatrix4x4 m;
    if(forward.SquareLength() < 1e-4 || up.SquareLength() < 1e-4) {
        LogError("A direction vector in <transform> is zero, ignoring trafo");
        return m;
    }

    forward.Normalize();
    up.Normalize();

    right = forward ^ up;
    if (std::fabs(up * forward) > 1e-4) {
        // this is definitely wrong - a degenerate coordinate space ruins everything
        // so substitute identity transform.
        LogError("<forward> and <up> vectors in <transform> are skewing, ignoring trafo");
        return m;
    }

    right *= scale;
    up *= scale;
    forward *= scale;

    m.a1 = right.x;
    m.b1 = right.y;
    m.c1 = right.z;

    m.a2 = up.x;
    m.b2 = up.y;
    m.c2 = up.z;

    m.a3 = forward.x;
    m.b3 = forward.y;
    m.c3 = forward.z;

    m.a4 = position.x;
    m.b4 = position.y;
    m.c4 = position.z;

    return m;
}